

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::release
          (file_pool_impl<libtorrent::aux::file_view_entry> *this)

{
  undefined1 local_30 [8];
  unique_lock<std::mutex> l2;
  unique_lock<std::mutex> l;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_local;
  
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&l2._M_owns,&this->m_mutex)
  ;
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,&this->m_destruction_mutex);
  boost::multi_index::
  multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
  ::operator=(&this->m_deferred_destruction,&this->m_files);
  ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&l2._M_owns);
  boost::multi_index::detail::
  ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>_>,_boost::multi_index::detail::nth_layer<1,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::clear(&(this->m_deferred_destruction).super_type.super_type);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&l2._M_owns);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::release()
	{
		std::unique_lock<std::mutex> l(m_mutex);
		std::unique_lock<std::mutex> l2(m_destruction_mutex);
		m_deferred_destruction = std::move(m_files);
		l.unlock();

		// the files and mappings will be destructed here, not holding the main
		// mutex
		m_deferred_destruction.clear();
	}